

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uint error;
  LodePNGDecompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  ucvector *out_local;
  
  if (settings->custom_inflate ==
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0) {
    out_local._4_4_ = lodepng_inflatev(out,in,insize,settings);
  }
  else {
    out_local._4_4_ = (*settings->custom_inflate)(&out->data,&out->size,in,insize,settings);
    out->allocsize = out->size;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned inflatev(ucvector* out, const unsigned char* in, size_t insize,
                        const LodePNGDecompressSettings* settings) {
  if(settings->custom_inflate) {
    unsigned error = settings->custom_inflate(&out->data, &out->size, in, insize, settings);
    out->allocsize = out->size;
    return error;
  } else {
    return lodepng_inflatev(out, in, insize, settings);
  }
}